

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  Scene *pSVar8;
  Ref<embree::Geometry> *pRVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  undefined1 auVar63 [16];
  AABBNodeMB4D *node1;
  ulong uVar64;
  ulong uVar65;
  long lVar66;
  int iVar67;
  uint uVar68;
  undefined8 *puVar69;
  ulong uVar70;
  long lVar71;
  ulong *puVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  long lVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  long lVar85;
  bool bVar86;
  bool bVar87;
  float fVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar106;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [16];
  float fVar129;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar133 [32];
  float fVar140;
  float fVar142;
  uint uVar143;
  float fVar144;
  uint uVar145;
  float fVar146;
  uint uVar147;
  float fVar148;
  uint uVar149;
  float fVar150;
  uint uVar151;
  float fVar152;
  uint uVar153;
  undefined1 auVar141 [32];
  uint uVar154;
  float fVar155;
  float fVar157;
  float fVar158;
  undefined1 auVar156 [16];
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  float fVar165;
  float fVar167;
  float fVar168;
  undefined1 auVar166 [16];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar174 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  float fVar184;
  undefined1 auVar183 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_dc0;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 *local_cc8;
  ulong local_cc0;
  ulong local_cb8;
  long local_cb0;
  ulong local_ca8;
  ulong local_ca0;
  ulong local_c98;
  ulong local_c90;
  ulong local_c88;
  undefined1 local_c80 [32];
  RTCFilterFunctionNArguments local_c50;
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined1 local_be0 [8];
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  undefined4 uStack_bc4;
  undefined1 local_bb0 [8];
  float fStack_ba8;
  float fStack_ba4;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  undefined1 local_b90 [8];
  float fStack_b88;
  float fStack_b84;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  undefined1 local_b70 [8];
  float fStack_b68;
  float fStack_b64;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  undefined1 local_b50 [8];
  float fStack_b48;
  float fStack_b44;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  undefined1 local_b30 [8];
  float fStack_b28;
  float fStack_b24;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [16];
  RTCHitN local_af0 [16];
  undefined4 local_ae0;
  undefined4 uStack_adc;
  undefined4 uStack_ad8;
  undefined4 uStack_ad4;
  undefined4 local_ad0;
  undefined4 uStack_acc;
  undefined4 uStack_ac8;
  undefined4 uStack_ac4;
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  uint local_a80;
  uint uStack_a7c;
  uint uStack_a78;
  uint uStack_a74;
  uint uStack_a70;
  uint uStack_a6c;
  uint uStack_a68;
  uint uStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  undefined4 uStack_a44;
  undefined1 local_a40 [32];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined4 uStack_924;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar123._4_4_ = uVar3;
  auVar123._0_4_ = uVar3;
  auVar123._8_4_ = uVar3;
  auVar123._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar126._4_4_ = uVar3;
  auVar126._0_4_ = uVar3;
  auVar126._8_4_ = uVar3;
  auVar126._12_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar130._4_4_ = uVar3;
  auVar130._0_4_ = uVar3;
  auVar130._8_4_ = uVar3;
  auVar130._12_4_ = uVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar76 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar79 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar81 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar67 = (tray->tnear).field_0.i[k];
  auVar163._4_4_ = iVar67;
  auVar163._0_4_ = iVar67;
  auVar163._8_4_ = iVar67;
  auVar163._12_4_ = iVar67;
  iVar67 = (tray->tfar).field_0.i[k];
  auVar166._4_4_ = iVar67;
  auVar166._0_4_ = iVar67;
  auVar166._8_4_ = iVar67;
  auVar166._12_4_ = iVar67;
  local_a40._16_16_ = mm_lookupmask_ps._240_16_;
  local_a40._0_16_ = mm_lookupmask_ps._0_16_;
  puVar69 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar112._8_4_ = 0x3f800000;
  auVar112._0_8_ = &DAT_3f8000003f800000;
  auVar112._12_4_ = 0x3f800000;
  auVar112._16_4_ = 0x3f800000;
  auVar112._20_4_ = 0x3f800000;
  auVar112._24_4_ = 0x3f800000;
  auVar112._28_4_ = 0x3f800000;
  auVar94._8_4_ = 0xbf800000;
  auVar94._0_8_ = 0xbf800000bf800000;
  auVar94._12_4_ = 0xbf800000;
  auVar94._16_4_ = 0xbf800000;
  auVar94._20_4_ = 0xbf800000;
  auVar94._24_4_ = 0xbf800000;
  auVar94._28_4_ = 0xbf800000;
  _local_a60 = vblendvps_avx(auVar112,auVar94,local_a40);
  local_dc0 = local_7f8;
  local_cc8 = puVar69;
  do {
    puVar72 = local_dc0;
    if (puVar72 == &local_800) break;
    local_dc0 = puVar72 + -1;
    uVar84 = puVar72[-1];
    do {
      if ((uVar84 & 8) == 0) {
        uVar64 = uVar84 & 0xfffffffffffffff0;
        fVar88 = *(float *)(ray + k * 4 + 0x70);
        auVar89._4_4_ = fVar88;
        auVar89._0_4_ = fVar88;
        auVar89._8_4_ = fVar88;
        auVar89._12_4_ = fVar88;
        pfVar2 = (float *)(uVar64 + 0x80 + uVar76);
        pfVar1 = (float *)(uVar64 + 0x20 + uVar76);
        auVar90._0_4_ = fVar88 * *pfVar2 + *pfVar1;
        auVar90._4_4_ = fVar88 * pfVar2[1] + pfVar1[1];
        auVar90._8_4_ = fVar88 * pfVar2[2] + pfVar1[2];
        auVar90._12_4_ = fVar88 * pfVar2[3] + pfVar1[3];
        auVar90 = vsubps_avx(auVar90,auVar123);
        auVar92._0_4_ = fVar4 * auVar90._0_4_;
        auVar92._4_4_ = fVar4 * auVar90._4_4_;
        auVar92._8_4_ = fVar4 * auVar90._8_4_;
        auVar92._12_4_ = fVar4 * auVar90._12_4_;
        auVar90 = vmaxps_avx(auVar163,auVar92);
        pfVar2 = (float *)(uVar64 + 0x80 + uVar79);
        pfVar1 = (float *)(uVar64 + 0x20 + uVar79);
        auVar93._0_4_ = fVar88 * *pfVar2 + *pfVar1;
        auVar93._4_4_ = fVar88 * pfVar2[1] + pfVar1[1];
        auVar93._8_4_ = fVar88 * pfVar2[2] + pfVar1[2];
        auVar93._12_4_ = fVar88 * pfVar2[3] + pfVar1[3];
        auVar92 = vsubps_avx(auVar93,auVar126);
        auVar107._0_4_ = fVar5 * auVar92._0_4_;
        auVar107._4_4_ = fVar5 * auVar92._4_4_;
        auVar107._8_4_ = fVar5 * auVar92._8_4_;
        auVar107._12_4_ = fVar5 * auVar92._12_4_;
        pfVar2 = (float *)(uVar64 + 0x80 + uVar81);
        pfVar1 = (float *)(uVar64 + 0x20 + uVar81);
        auVar116._0_4_ = fVar88 * *pfVar2 + *pfVar1;
        auVar116._4_4_ = fVar88 * pfVar2[1] + pfVar1[1];
        auVar116._8_4_ = fVar88 * pfVar2[2] + pfVar1[2];
        auVar116._12_4_ = fVar88 * pfVar2[3] + pfVar1[3];
        auVar92 = vsubps_avx(auVar116,auVar130);
        auVar117._0_4_ = fVar6 * auVar92._0_4_;
        auVar117._4_4_ = fVar6 * auVar92._4_4_;
        auVar117._8_4_ = fVar6 * auVar92._8_4_;
        auVar117._12_4_ = fVar6 * auVar92._12_4_;
        auVar92 = vmaxps_avx(auVar107,auVar117);
        auVar90 = vmaxps_avx(auVar90,auVar92);
        pfVar2 = (float *)(uVar64 + 0x80 + (uVar76 ^ 0x10));
        pfVar1 = (float *)(uVar64 + 0x20 + (uVar76 ^ 0x10));
        auVar108._0_4_ = fVar88 * *pfVar2 + *pfVar1;
        auVar108._4_4_ = fVar88 * pfVar2[1] + pfVar1[1];
        auVar108._8_4_ = fVar88 * pfVar2[2] + pfVar1[2];
        auVar108._12_4_ = fVar88 * pfVar2[3] + pfVar1[3];
        auVar92 = vsubps_avx(auVar108,auVar123);
        auVar109._0_4_ = fVar4 * auVar92._0_4_;
        auVar109._4_4_ = fVar4 * auVar92._4_4_;
        auVar109._8_4_ = fVar4 * auVar92._8_4_;
        auVar109._12_4_ = fVar4 * auVar92._12_4_;
        pfVar2 = (float *)(uVar64 + 0x80 + (uVar79 ^ 0x10));
        auVar92 = vminps_avx(auVar166,auVar109);
        pfVar1 = (float *)(uVar64 + 0x20 + (uVar79 ^ 0x10));
        auVar118._0_4_ = fVar88 * *pfVar2 + *pfVar1;
        auVar118._4_4_ = fVar88 * pfVar2[1] + pfVar1[1];
        auVar118._8_4_ = fVar88 * pfVar2[2] + pfVar1[2];
        auVar118._12_4_ = fVar88 * pfVar2[3] + pfVar1[3];
        auVar93 = vsubps_avx(auVar118,auVar126);
        pfVar2 = (float *)(uVar64 + 0x80 + (uVar81 ^ 0x10));
        pfVar1 = (float *)(uVar64 + 0x20 + (uVar81 ^ 0x10));
        auVar120._0_4_ = fVar88 * *pfVar2 + *pfVar1;
        auVar120._4_4_ = fVar88 * pfVar2[1] + pfVar1[1];
        auVar120._8_4_ = fVar88 * pfVar2[2] + pfVar1[2];
        auVar120._12_4_ = fVar88 * pfVar2[3] + pfVar1[3];
        auVar119._0_4_ = fVar5 * auVar93._0_4_;
        auVar119._4_4_ = fVar5 * auVar93._4_4_;
        auVar119._8_4_ = fVar5 * auVar93._8_4_;
        auVar119._12_4_ = fVar5 * auVar93._12_4_;
        auVar93 = vsubps_avx(auVar120,auVar130);
        auVar121._0_4_ = fVar6 * auVar93._0_4_;
        auVar121._4_4_ = fVar6 * auVar93._4_4_;
        auVar121._8_4_ = fVar6 * auVar93._8_4_;
        auVar121._12_4_ = fVar6 * auVar93._12_4_;
        auVar93 = vminps_avx(auVar119,auVar121);
        auVar92 = vminps_avx(auVar92,auVar93);
        if (((uint)uVar84 & 7) == 6) {
          auVar92 = vcmpps_avx(auVar90,auVar92,2);
          auVar90 = vcmpps_avx(*(undefined1 (*) [16])(uVar64 + 0xe0),auVar89,2);
          auVar93 = vcmpps_avx(auVar89,*(undefined1 (*) [16])(uVar64 + 0xf0),1);
          auVar90 = vandps_avx(auVar90,auVar93);
          auVar90 = vandps_avx(auVar90,auVar92);
        }
        else {
          auVar90 = vcmpps_avx(auVar90,auVar92,2);
        }
        auVar90 = vpslld_avx(auVar90,0x1f);
        uVar68 = vmovmskps_avx(auVar90);
        puVar69 = (undefined8 *)(ulong)uVar68;
      }
      if ((uVar84 & 8) == 0) {
        if (puVar69 == (undefined8 *)0x0) {
          uVar68 = 4;
        }
        else {
          uVar64 = uVar84 & 0xfffffffffffffff0;
          lVar71 = 0;
          if (puVar69 != (undefined8 *)0x0) {
            for (; ((ulong)puVar69 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
            }
          }
          uVar84 = *(ulong *)(uVar64 + lVar71 * 8);
          uVar70 = (long)puVar69 - 1U & (ulong)puVar69;
          if (uVar70 != 0) {
            *local_dc0 = uVar84;
            lVar71 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
              }
            }
            uVar65 = uVar70 - 1;
            while( true ) {
              local_dc0 = local_dc0 + 1;
              uVar84 = *(ulong *)(uVar64 + lVar71 * 8);
              uVar65 = uVar65 & uVar70;
              if (uVar65 == 0) break;
              *local_dc0 = uVar84;
              lVar71 = 0;
              if (uVar65 != 0) {
                for (; (uVar65 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
                }
              }
              uVar70 = uVar65 - 1;
            }
          }
          uVar68 = 0;
        }
      }
      else {
        uVar68 = 6;
      }
    } while (uVar68 == 0);
    if (uVar68 == 6) {
      uVar68 = 0;
      local_cc0 = (ulong)((uint)uVar84 & 0xf) - 8;
      bVar86 = local_cc0 != 0;
      if (bVar86) {
        uVar84 = uVar84 & 0xfffffffffffffff0;
        local_cb8 = 0;
        do {
          lVar66 = local_cb8 * 0x60;
          pSVar8 = context->scene;
          pRVar9 = (pSVar8->geometries).items;
          pGVar10 = pRVar9[*(uint *)(uVar84 + 0x40 + lVar66)].ptr;
          fVar88 = (pGVar10->time_range).lower;
          fVar88 = pGVar10->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0x70) - fVar88) /
                   ((pGVar10->time_range).upper - fVar88));
          auVar90 = vroundss_avx(ZEXT416((uint)fVar88),ZEXT416((uint)fVar88),9);
          auVar90 = vminss_avx(auVar90,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
          auVar121 = vmaxss_avx(ZEXT816(0) << 0x20,auVar90);
          iVar67 = (int)auVar121._0_4_;
          lVar77 = (long)iVar67 * 0x38;
          lVar71 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar77);
          local_ca0 = (ulong)*(uint *)(uVar84 + 4 + lVar66);
          auVar90 = *(undefined1 (*) [16])(lVar71 + (ulong)*(uint *)(uVar84 + lVar66) * 4);
          uVar70 = (ulong)*(uint *)(uVar84 + 0x10 + lVar66);
          auVar92 = *(undefined1 (*) [16])(lVar71 + uVar70 * 4);
          uVar65 = (ulong)*(uint *)(uVar84 + 0x20 + lVar66);
          auVar93 = *(undefined1 (*) [16])(lVar71 + uVar65 * 4);
          uVar73 = (ulong)*(uint *)(uVar84 + 0x30 + lVar66);
          auVar89 = *(undefined1 (*) [16])(lVar71 + uVar73 * 4);
          local_cb0 = *(long *)&pRVar9[*(uint *)(uVar84 + 0x44 + lVar66)].ptr[2].numPrimitives;
          lVar71 = *(long *)(local_cb0 + lVar77);
          auVar107 = *(undefined1 (*) [16])(lVar71 + local_ca0 * 4);
          local_c90 = (ulong)*(uint *)(uVar84 + 0x14 + lVar66);
          auVar108 = *(undefined1 (*) [16])(lVar71 + local_c90 * 4);
          local_c88 = (ulong)*(uint *)(uVar84 + 0x24 + lVar66);
          auVar109 = *(undefined1 (*) [16])(lVar71 + local_c88 * 4);
          uVar74 = (ulong)*(uint *)(uVar84 + 0x34 + lVar66);
          auVar116 = *(undefined1 (*) [16])(lVar71 + uVar74 * 4);
          lVar71 = *(long *)&pRVar9[*(uint *)(uVar84 + 0x48 + lVar66)].ptr[2].numPrimitives;
          lVar11 = *(long *)(lVar71 + lVar77);
          uVar75 = (ulong)*(uint *)(uVar84 + 8 + lVar66);
          auVar117 = *(undefined1 (*) [16])(lVar11 + uVar75 * 4);
          uVar83 = (ulong)*(uint *)(uVar84 + 0x18 + lVar66);
          auVar118 = *(undefined1 (*) [16])(lVar11 + uVar83 * 4);
          local_ca8 = (ulong)*(uint *)(uVar84 + 0x28 + lVar66);
          auVar119 = *(undefined1 (*) [16])(lVar11 + local_ca8 * 4);
          local_c98 = (ulong)*(uint *)(uVar84 + 0x38 + lVar66);
          auVar120 = *(undefined1 (*) [16])(lVar11 + local_c98 * 4);
          fVar88 = fVar88 - auVar121._0_4_;
          local_b00 = ZEXT416((uint)fVar88);
          lVar11 = *(long *)&pRVar9[*(uint *)(uVar84 + 0x4c + lVar66)].ptr[2].numPrimitives;
          lVar77 = *(long *)(lVar11 + lVar77);
          uVar64 = (ulong)*(uint *)(uVar84 + 0xc + lVar66);
          auVar121 = *(undefined1 (*) [16])(lVar77 + uVar64 * 4);
          uVar82 = (ulong)*(uint *)(uVar84 + 0x1c + lVar66);
          auVar91 = *(undefined1 (*) [16])(lVar77 + uVar82 * 4);
          auVar110 = vunpcklps_avx(auVar90,auVar117);
          auVar117 = vunpckhps_avx(auVar90,auVar117);
          auVar44 = vunpcklps_avx(auVar107,auVar121);
          auVar107 = vunpckhps_avx(auVar107,auVar121);
          uVar78 = (ulong)*(uint *)(uVar84 + 0x2c + lVar66);
          auVar90 = *(undefined1 (*) [16])(lVar77 + uVar78 * 4);
          _local_b20 = vunpcklps_avx(auVar117,auVar107);
          _local_b60 = vunpcklps_avx(auVar110,auVar44);
          _local_b40 = vunpckhps_avx(auVar110,auVar44);
          auVar117 = vunpcklps_avx(auVar92,auVar118);
          auVar107 = vunpckhps_avx(auVar92,auVar118);
          auVar118 = vunpcklps_avx(auVar108,auVar91);
          auVar108 = vunpckhps_avx(auVar108,auVar91);
          uVar80 = (ulong)*(uint *)(uVar84 + 0x3c + lVar66);
          auVar92 = *(undefined1 (*) [16])(lVar77 + uVar80 * 4);
          _local_b10 = vunpcklps_avx(auVar107,auVar108);
          _local_b50 = vunpcklps_avx(auVar117,auVar118);
          _local_b30 = vunpckhps_avx(auVar117,auVar118);
          auVar108 = vunpcklps_avx(auVar93,auVar119);
          auVar93 = vunpckhps_avx(auVar93,auVar119);
          auVar117 = vunpcklps_avx(auVar109,auVar90);
          auVar107 = vunpckhps_avx(auVar109,auVar90);
          lVar85 = (long)(iVar67 + 1) * 0x38;
          lVar77 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar85);
          auVar90 = *(undefined1 (*) [16])(lVar77 + (ulong)*(uint *)(uVar84 + lVar66) * 4);
          _local_b70 = vunpcklps_avx(auVar93,auVar107);
          _local_bb0 = vunpcklps_avx(auVar108,auVar117);
          _local_ba0 = vunpckhps_avx(auVar108,auVar117);
          auVar107 = vunpcklps_avx(auVar89,auVar120);
          auVar93 = vunpckhps_avx(auVar89,auVar120);
          auVar108 = vunpcklps_avx(auVar116,auVar92);
          auVar89 = vunpckhps_avx(auVar116,auVar92);
          lVar71 = *(long *)(lVar71 + lVar85);
          auVar92 = *(undefined1 (*) [16])(lVar71 + uVar75 * 4);
          _local_b80 = vunpcklps_avx(auVar93,auVar89);
          auVar109 = vunpcklps_avx(auVar107,auVar108);
          _local_b90 = vunpckhps_avx(auVar107,auVar108);
          lVar12 = *(long *)(local_cb0 + lVar85);
          auVar89 = vunpcklps_avx(auVar90,auVar92);
          auVar93 = vunpckhps_avx(auVar90,auVar92);
          auVar90 = *(undefined1 (*) [16])(lVar12 + local_ca0 * 4);
          lVar11 = *(long *)(lVar11 + lVar85);
          auVar92 = *(undefined1 (*) [16])(lVar11 + uVar64 * 4);
          auVar107 = vunpcklps_avx(auVar90,auVar92);
          auVar90 = vunpckhps_avx(auVar90,auVar92);
          auVar116 = vunpcklps_avx(auVar93,auVar90);
          auVar117 = vunpcklps_avx(auVar89,auVar107);
          auVar93 = vunpckhps_avx(auVar89,auVar107);
          auVar90 = *(undefined1 (*) [16])(lVar77 + uVar70 * 4);
          auVar92 = *(undefined1 (*) [16])(lVar71 + uVar83 * 4);
          auVar107 = vunpcklps_avx(auVar90,auVar92);
          auVar89 = vunpckhps_avx(auVar90,auVar92);
          auVar90 = *(undefined1 (*) [16])(lVar12 + local_c90 * 4);
          auVar92 = *(undefined1 (*) [16])(lVar11 + uVar82 * 4);
          auVar108 = vunpcklps_avx(auVar90,auVar92);
          auVar90 = vunpckhps_avx(auVar90,auVar92);
          auVar118 = vunpcklps_avx(auVar89,auVar90);
          auVar119 = vunpcklps_avx(auVar107,auVar108);
          auVar89 = vunpckhps_avx(auVar107,auVar108);
          auVar90 = *(undefined1 (*) [16])(lVar77 + uVar65 * 4);
          auVar92 = *(undefined1 (*) [16])(lVar71 + local_ca8 * 4);
          auVar108 = vunpcklps_avx(auVar90,auVar92);
          auVar107 = vunpckhps_avx(auVar90,auVar92);
          auVar90 = *(undefined1 (*) [16])(lVar12 + local_c88 * 4);
          auVar92 = *(undefined1 (*) [16])(lVar11 + uVar78 * 4);
          auVar120 = vunpcklps_avx(auVar90,auVar92);
          auVar90 = vunpckhps_avx(auVar90,auVar92);
          auVar121 = vunpcklps_avx(auVar107,auVar90);
          auVar91 = vunpcklps_avx(auVar108,auVar120);
          auVar107 = vunpckhps_avx(auVar108,auVar120);
          auVar90 = *(undefined1 (*) [16])(lVar77 + uVar73 * 4);
          auVar92 = *(undefined1 (*) [16])(lVar71 + local_c98 * 4);
          auVar120 = vunpcklps_avx(auVar90,auVar92);
          auVar108 = vunpckhps_avx(auVar90,auVar92);
          auVar90 = *(undefined1 (*) [16])(lVar12 + uVar74 * 4);
          auVar92 = *(undefined1 (*) [16])(lVar11 + uVar80 * 4);
          auVar110 = vunpcklps_avx(auVar90,auVar92);
          auVar90 = vunpckhps_avx(auVar90,auVar92);
          auVar44 = vunpcklps_avx(auVar108,auVar90);
          auVar124 = vunpcklps_avx(auVar120,auVar110);
          auVar108 = vunpckhps_avx(auVar120,auVar110);
          auVar90 = vshufps_avx(local_b00,local_b00,0);
          auVar92 = ZEXT416((uint)(1.0 - fVar88));
          auVar92 = vshufps_avx(auVar92,auVar92,0);
          fVar88 = auVar90._0_4_;
          fVar98 = auVar90._4_4_;
          fVar99 = auVar90._8_4_;
          fVar100 = auVar90._12_4_;
          fVar101 = auVar92._0_4_;
          fVar102 = auVar92._4_4_;
          fVar103 = auVar92._8_4_;
          fVar106 = auVar92._12_4_;
          auVar131._4_4_ = fVar102 * (float)local_b60._4_4_ + auVar117._4_4_ * fVar98;
          auVar131._0_4_ = fVar101 * (float)local_b60._0_4_ + auVar117._0_4_ * fVar88;
          auVar131._8_4_ = fVar103 * fStack_b58 + auVar117._8_4_ * fVar99;
          auVar131._12_4_ = fVar106 * fStack_b54 + auVar117._12_4_ * fVar100;
          auVar133._0_4_ = fVar101 * (float)local_b40._0_4_ + auVar93._0_4_ * fVar88;
          auVar133._4_4_ = fVar102 * (float)local_b40._4_4_ + auVar93._4_4_ * fVar98;
          auVar133._8_4_ = fVar103 * fStack_b38 + auVar93._8_4_ * fVar99;
          auVar133._12_4_ = fVar106 * fStack_b34 + auVar93._12_4_ * fVar100;
          auVar164._4_4_ = fVar102 * (float)local_b20._4_4_ + auVar116._4_4_ * fVar98;
          auVar164._0_4_ = fVar101 * (float)local_b20._0_4_ + auVar116._0_4_ * fVar88;
          auVar164._8_4_ = fVar103 * fStack_b18 + auVar116._8_4_ * fVar99;
          auVar164._12_4_ = fVar106 * fStack_b14 + auVar116._12_4_ * fVar100;
          auVar156._0_4_ = fVar101 * (float)local_b50._0_4_ + fVar88 * auVar119._0_4_;
          auVar156._4_4_ = fVar102 * (float)local_b50._4_4_ + fVar98 * auVar119._4_4_;
          auVar156._8_4_ = fVar103 * fStack_b48 + fVar99 * auVar119._8_4_;
          auVar156._12_4_ = fVar106 * fStack_b44 + fVar100 * auVar119._12_4_;
          auVar110._0_4_ = fVar101 * (float)local_b30._0_4_ + fVar88 * auVar89._0_4_;
          auVar110._4_4_ = fVar102 * (float)local_b30._4_4_ + fVar98 * auVar89._4_4_;
          auVar110._8_4_ = fVar103 * fStack_b28 + fVar99 * auVar89._8_4_;
          auVar110._12_4_ = fVar106 * fStack_b24 + fVar100 * auVar89._12_4_;
          auVar181._0_4_ = fVar101 * (float)local_b10._0_4_ + auVar118._0_4_ * fVar88;
          auVar181._4_4_ = fVar102 * (float)local_b10._4_4_ + auVar118._4_4_ * fVar98;
          auVar181._8_4_ = fVar103 * fStack_b08 + auVar118._8_4_ * fVar99;
          auVar181._12_4_ = fVar106 * fStack_b04 + auVar118._12_4_ * fVar100;
          auVar131._20_4_ = fVar102 * (float)local_bb0._4_4_ + fVar98 * auVar91._4_4_;
          auVar131._16_4_ = fVar101 * (float)local_bb0._0_4_ + fVar88 * auVar91._0_4_;
          auVar131._24_4_ = fVar103 * fStack_ba8 + fVar99 * auVar91._8_4_;
          auVar131._28_4_ = fVar106 * fStack_ba4 + fVar100 * auVar91._12_4_;
          auVar133._20_4_ = fVar102 * (float)local_ba0._4_4_ + auVar107._4_4_ * fVar98;
          auVar133._16_4_ = fVar101 * (float)local_ba0._0_4_ + auVar107._0_4_ * fVar88;
          auVar133._24_4_ = fVar103 * fStack_b98 + auVar107._8_4_ * fVar99;
          auVar133._28_4_ = fVar106 * fStack_b94 + auVar107._12_4_ * fVar100;
          auVar164._20_4_ = fVar102 * (float)local_b70._4_4_ + auVar121._4_4_ * fVar98;
          auVar164._16_4_ = fVar101 * (float)local_b70._0_4_ + auVar121._0_4_ * fVar88;
          auVar164._24_4_ = fVar103 * fStack_b68 + auVar121._8_4_ * fVar99;
          fVar184 = fVar106 * fStack_b64 + auVar121._12_4_ * fVar100;
          auVar164._28_4_ = fVar184;
          lVar71 = uVar84 + 0x40 + lVar66;
          local_a00 = *(undefined8 *)(lVar71 + 0x10);
          uStack_9f8 = *(undefined8 *)(lVar71 + 0x18);
          auVar122._0_4_ = auVar109._0_4_ * fVar101 + fVar88 * auVar124._0_4_;
          auVar122._4_4_ = auVar109._4_4_ * fVar102 + fVar98 * auVar124._4_4_;
          auVar122._8_4_ = auVar109._8_4_ * fVar103 + fVar99 * auVar124._8_4_;
          auVar122._12_4_ = auVar109._12_4_ * fVar106 + fVar100 * auVar124._12_4_;
          uStack_9f0 = local_a00;
          uStack_9e8 = uStack_9f8;
          lVar66 = uVar84 + 0x50 + lVar66;
          local_a20 = *(undefined8 *)(lVar66 + 0x10);
          uStack_a18 = *(undefined8 *)(lVar66 + 0x18);
          auVar124._0_4_ = fVar101 * (float)local_b90._0_4_ + fVar88 * auVar108._0_4_;
          auVar124._4_4_ = fVar102 * (float)local_b90._4_4_ + fVar98 * auVar108._4_4_;
          auVar124._8_4_ = fVar103 * fStack_b88 + fVar99 * auVar108._8_4_;
          auVar124._12_4_ = fVar106 * fStack_b84 + fVar100 * auVar108._12_4_;
          auVar91._0_4_ = fVar101 * (float)local_b80._0_4_ + fVar88 * auVar44._0_4_;
          auVar91._4_4_ = fVar102 * (float)local_b80._4_4_ + fVar98 * auVar44._4_4_;
          auVar91._8_4_ = fVar103 * fStack_b78 + fVar99 * auVar44._8_4_;
          auVar91._12_4_ = fVar106 * fStack_b74 + fVar100 * auVar44._12_4_;
          uStack_a10 = local_a20;
          uStack_a08 = uStack_a18;
          auVar104._16_16_ = auVar156;
          auVar104._0_16_ = auVar156;
          auVar113._16_16_ = auVar110;
          auVar113._0_16_ = auVar110;
          auVar127._16_16_ = auVar181;
          auVar127._0_16_ = auVar181;
          auVar141._16_16_ = auVar122;
          auVar141._0_16_ = auVar122;
          auVar125._16_16_ = auVar124;
          auVar125._0_16_ = auVar124;
          auVar95._16_16_ = auVar91;
          auVar95._0_16_ = auVar91;
          local_c80 = vsubps_avx(auVar131,auVar104);
          auVar94 = vsubps_avx(auVar133,auVar113);
          auVar112 = vsubps_avx(auVar164,auVar127);
          auVar97 = vsubps_avx(auVar141,auVar131);
          auVar104 = vsubps_avx(auVar125,auVar133);
          auVar95 = vsubps_avx(auVar95,auVar164);
          fVar100 = auVar94._0_4_;
          fVar165 = auVar95._0_4_;
          fVar129 = auVar94._4_4_;
          fVar167 = auVar95._4_4_;
          auVar42._4_4_ = fVar167 * fVar129;
          auVar42._0_4_ = fVar165 * fVar100;
          fVar17 = auVar94._8_4_;
          fVar168 = auVar95._8_4_;
          auVar42._8_4_ = fVar168 * fVar17;
          fVar22 = auVar94._12_4_;
          fVar169 = auVar95._12_4_;
          auVar42._12_4_ = fVar169 * fVar22;
          fVar27 = auVar94._16_4_;
          fVar170 = auVar95._16_4_;
          auVar42._16_4_ = fVar170 * fVar27;
          fVar32 = auVar94._20_4_;
          fVar171 = auVar95._20_4_;
          auVar42._20_4_ = fVar171 * fVar32;
          fVar37 = auVar94._24_4_;
          fVar172 = auVar95._24_4_;
          auVar42._24_4_ = fVar172 * fVar37;
          auVar42._28_4_ = auVar91._12_4_;
          fVar101 = auVar112._0_4_;
          fVar155 = auVar104._0_4_;
          fVar14 = auVar112._4_4_;
          fVar157 = auVar104._4_4_;
          auVar43._4_4_ = fVar157 * fVar14;
          auVar43._0_4_ = fVar155 * fVar101;
          fVar18 = auVar112._8_4_;
          fVar158 = auVar104._8_4_;
          auVar43._8_4_ = fVar158 * fVar18;
          fVar23 = auVar112._12_4_;
          fVar159 = auVar104._12_4_;
          auVar43._12_4_ = fVar159 * fVar23;
          fVar28 = auVar112._16_4_;
          fVar160 = auVar104._16_4_;
          auVar43._16_4_ = fVar160 * fVar28;
          fVar33 = auVar112._20_4_;
          fVar161 = auVar104._20_4_;
          auVar43._20_4_ = fVar161 * fVar33;
          fVar38 = auVar112._24_4_;
          fVar162 = auVar104._24_4_;
          auVar43._24_4_ = fVar162 * fVar38;
          auVar43._28_4_ = auVar156._12_4_;
          local_960 = vsubps_avx(auVar43,auVar42);
          fVar140 = auVar97._0_4_;
          fVar142 = auVar97._4_4_;
          auVar45._4_4_ = fVar142 * fVar14;
          auVar45._0_4_ = fVar140 * fVar101;
          fVar144 = auVar97._8_4_;
          auVar45._8_4_ = fVar144 * fVar18;
          fVar146 = auVar97._12_4_;
          auVar45._12_4_ = fVar146 * fVar23;
          fVar148 = auVar97._16_4_;
          auVar45._16_4_ = fVar148 * fVar28;
          fVar150 = auVar97._20_4_;
          auVar45._20_4_ = fVar150 * fVar33;
          fVar152 = auVar97._24_4_;
          auVar45._24_4_ = fVar152 * fVar38;
          auVar45._28_4_ = auVar156._12_4_;
          fVar173 = local_c80._0_4_;
          fVar175 = local_c80._4_4_;
          auVar46._4_4_ = fVar175 * fVar167;
          auVar46._0_4_ = fVar173 * fVar165;
          fVar176 = local_c80._8_4_;
          auVar46._8_4_ = fVar176 * fVar168;
          fVar177 = local_c80._12_4_;
          auVar46._12_4_ = fVar177 * fVar169;
          fVar178 = local_c80._16_4_;
          auVar46._16_4_ = fVar178 * fVar170;
          fVar179 = local_c80._20_4_;
          auVar46._20_4_ = fVar179 * fVar171;
          fVar180 = local_c80._24_4_;
          auVar46._24_4_ = fVar180 * fVar172;
          auVar46._28_4_ = auVar110._12_4_;
          _local_be0 = vsubps_avx(auVar46,auVar45);
          auVar47._4_4_ = fVar175 * fVar157;
          auVar47._0_4_ = fVar173 * fVar155;
          auVar47._8_4_ = fVar176 * fVar158;
          auVar47._12_4_ = fVar177 * fVar159;
          auVar47._16_4_ = fVar178 * fVar160;
          auVar47._20_4_ = fVar179 * fVar161;
          auVar47._24_4_ = fVar180 * fVar162;
          auVar47._28_4_ = auVar110._12_4_;
          auVar48._4_4_ = fVar142 * fVar129;
          auVar48._0_4_ = fVar140 * fVar100;
          auVar48._8_4_ = fVar144 * fVar17;
          auVar48._12_4_ = fVar146 * fVar22;
          auVar48._16_4_ = fVar148 * fVar27;
          auVar48._20_4_ = fVar150 * fVar32;
          auVar48._24_4_ = fVar152 * fVar37;
          auVar48._28_4_ = auVar124._12_4_;
          uVar3 = *(undefined4 *)(ray + k * 4);
          auVar174._4_4_ = uVar3;
          auVar174._0_4_ = uVar3;
          auVar174._8_4_ = uVar3;
          auVar174._12_4_ = uVar3;
          auVar174._16_4_ = uVar3;
          auVar174._20_4_ = uVar3;
          auVar174._24_4_ = uVar3;
          auVar174._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar182._4_4_ = uVar3;
          auVar182._0_4_ = uVar3;
          auVar182._8_4_ = uVar3;
          auVar182._12_4_ = uVar3;
          auVar182._16_4_ = uVar3;
          auVar182._20_4_ = uVar3;
          auVar182._24_4_ = uVar3;
          auVar182._28_4_ = uVar3;
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar183._4_4_ = uVar7;
          auVar183._0_4_ = uVar7;
          auVar183._8_4_ = uVar7;
          auVar183._12_4_ = uVar7;
          auVar183._16_4_ = uVar7;
          auVar183._20_4_ = uVar7;
          auVar183._24_4_ = uVar7;
          auVar183._28_4_ = uVar7;
          fVar88 = *(float *)(ray + k * 4 + 0x50);
          local_c20 = vsubps_avx(auVar48,auVar47);
          local_c00 = vsubps_avx(auVar131,auVar174);
          fVar98 = *(float *)(ray + k * 4 + 0x60);
          auVar94 = vsubps_avx(auVar133,auVar182);
          auVar112 = vsubps_avx(auVar164,auVar183);
          fVar132 = auVar112._0_4_;
          fVar134 = auVar112._4_4_;
          auVar49._4_4_ = fVar134 * fVar88;
          auVar49._0_4_ = fVar132 * fVar88;
          fVar135 = auVar112._8_4_;
          auVar49._8_4_ = fVar135 * fVar88;
          fVar136 = auVar112._12_4_;
          auVar49._12_4_ = fVar136 * fVar88;
          fVar137 = auVar112._16_4_;
          auVar49._16_4_ = fVar137 * fVar88;
          fVar138 = auVar112._20_4_;
          auVar49._20_4_ = fVar138 * fVar88;
          fVar139 = auVar112._24_4_;
          auVar49._24_4_ = fVar139 * fVar88;
          auVar49._28_4_ = fVar184;
          fVar102 = auVar94._0_4_;
          fVar184 = auVar94._4_4_;
          auVar50._4_4_ = fVar98 * fVar184;
          auVar50._0_4_ = fVar98 * fVar102;
          fVar19 = auVar94._8_4_;
          auVar50._8_4_ = fVar98 * fVar19;
          fVar24 = auVar94._12_4_;
          auVar50._12_4_ = fVar98 * fVar24;
          fVar29 = auVar94._16_4_;
          auVar50._16_4_ = fVar98 * fVar29;
          fVar34 = auVar94._20_4_;
          auVar50._20_4_ = fVar98 * fVar34;
          fVar39 = auVar94._24_4_;
          auVar50._24_4_ = fVar98 * fVar39;
          auVar50._28_4_ = uVar3;
          auVar112 = vsubps_avx(auVar50,auVar49);
          fVar99 = *(float *)(ray + k * 4 + 0x40);
          fVar103 = local_c00._0_4_;
          fVar15 = local_c00._4_4_;
          auVar51._4_4_ = fVar98 * fVar15;
          auVar51._0_4_ = fVar98 * fVar103;
          fVar20 = local_c00._8_4_;
          auVar51._8_4_ = fVar98 * fVar20;
          fVar25 = local_c00._12_4_;
          auVar51._12_4_ = fVar98 * fVar25;
          fVar30 = local_c00._16_4_;
          auVar51._16_4_ = fVar98 * fVar30;
          fVar35 = local_c00._20_4_;
          auVar51._20_4_ = fVar98 * fVar35;
          fVar40 = local_c00._24_4_;
          auVar51._24_4_ = fVar98 * fVar40;
          auVar51._28_4_ = uVar7;
          auVar52._4_4_ = fVar134 * fVar99;
          auVar52._0_4_ = fVar132 * fVar99;
          auVar52._8_4_ = fVar135 * fVar99;
          auVar52._12_4_ = fVar136 * fVar99;
          auVar52._16_4_ = fVar137 * fVar99;
          auVar52._20_4_ = fVar138 * fVar99;
          auVar52._24_4_ = fVar139 * fVar99;
          auVar52._28_4_ = auVar156._12_4_;
          auVar42 = vsubps_avx(auVar52,auVar51);
          auVar53._4_4_ = fVar99 * fVar184;
          auVar53._0_4_ = fVar99 * fVar102;
          auVar53._8_4_ = fVar99 * fVar19;
          auVar53._12_4_ = fVar99 * fVar24;
          auVar53._16_4_ = fVar99 * fVar29;
          auVar53._20_4_ = fVar99 * fVar34;
          auVar53._24_4_ = fVar99 * fVar39;
          auVar53._28_4_ = uVar7;
          auVar54._4_4_ = fVar15 * fVar88;
          auVar54._0_4_ = fVar103 * fVar88;
          auVar54._8_4_ = fVar20 * fVar88;
          auVar54._12_4_ = fVar25 * fVar88;
          auVar54._16_4_ = fVar30 * fVar88;
          auVar54._20_4_ = fVar35 * fVar88;
          auVar54._24_4_ = fVar40 * fVar88;
          auVar54._28_4_ = local_c00._28_4_;
          auVar43 = vsubps_avx(auVar54,auVar53);
          local_920 = local_c20._0_4_;
          fStack_91c = local_c20._4_4_;
          fStack_918 = local_c20._8_4_;
          fStack_914 = local_c20._12_4_;
          fStack_910 = local_c20._16_4_;
          fStack_90c = local_c20._20_4_;
          fStack_908 = local_c20._24_4_;
          fVar106 = local_960._0_4_;
          fVar16 = local_960._4_4_;
          fVar21 = local_960._8_4_;
          fVar26 = local_960._12_4_;
          fVar31 = local_960._16_4_;
          fVar36 = local_960._20_4_;
          fVar41 = local_960._24_4_;
          auVar96._0_4_ = fVar99 * fVar106 + fVar98 * local_920 + (float)local_be0._0_4_ * fVar88;
          auVar96._4_4_ = fVar99 * fVar16 + fVar98 * fStack_91c + (float)local_be0._4_4_ * fVar88;
          auVar96._8_4_ = fVar99 * fVar21 + fVar98 * fStack_918 + fStack_bd8 * fVar88;
          auVar96._12_4_ = fVar99 * fVar26 + fVar98 * fStack_914 + fStack_bd4 * fVar88;
          auVar96._16_4_ = fVar99 * fVar31 + fVar98 * fStack_910 + fStack_bd0 * fVar88;
          auVar96._20_4_ = fVar99 * fVar36 + fVar98 * fStack_90c + fStack_bcc * fVar88;
          auVar96._24_4_ = fVar99 * fVar41 + fVar98 * fStack_908 + fStack_bc8 * fVar88;
          auVar96._28_4_ = fVar98 + fVar98 + fVar88;
          auVar114._8_4_ = 0x80000000;
          auVar114._0_8_ = 0x8000000080000000;
          auVar114._12_4_ = 0x80000000;
          auVar114._16_4_ = 0x80000000;
          auVar114._20_4_ = 0x80000000;
          auVar114._24_4_ = 0x80000000;
          auVar114._28_4_ = 0x80000000;
          auVar94 = vandps_avx(auVar96,auVar114);
          uVar68 = auVar94._0_4_;
          local_9e0._0_4_ =
               (float)(uVar68 ^ (uint)(fVar140 * auVar112._0_4_ +
                                      fVar165 * auVar43._0_4_ + fVar155 * auVar42._0_4_));
          uVar143 = auVar94._4_4_;
          local_9e0._4_4_ =
               (float)(uVar143 ^
                      (uint)(fVar142 * auVar112._4_4_ +
                            fVar167 * auVar43._4_4_ + fVar157 * auVar42._4_4_));
          uVar145 = auVar94._8_4_;
          local_9e0._8_4_ =
               (float)(uVar145 ^
                      (uint)(fVar144 * auVar112._8_4_ +
                            fVar168 * auVar43._8_4_ + fVar158 * auVar42._8_4_));
          uVar147 = auVar94._12_4_;
          local_9e0._12_4_ =
               (float)(uVar147 ^
                      (uint)(fVar146 * auVar112._12_4_ +
                            fVar169 * auVar43._12_4_ + fVar159 * auVar42._12_4_));
          uVar149 = auVar94._16_4_;
          local_9e0._16_4_ =
               (float)(uVar149 ^
                      (uint)(fVar148 * auVar112._16_4_ +
                            fVar170 * auVar43._16_4_ + fVar160 * auVar42._16_4_));
          uVar151 = auVar94._20_4_;
          local_9e0._20_4_ =
               (float)(uVar151 ^
                      (uint)(fVar150 * auVar112._20_4_ +
                            fVar171 * auVar43._20_4_ + fVar161 * auVar42._20_4_));
          uVar153 = auVar94._24_4_;
          local_9e0._24_4_ =
               (float)(uVar153 ^
                      (uint)(fVar152 * auVar112._24_4_ +
                            fVar172 * auVar43._24_4_ + fVar162 * auVar42._24_4_));
          uVar154 = auVar94._28_4_;
          local_9e0._28_4_ =
               (float)(uVar154 ^ (uint)(auVar97._28_4_ + auVar95._28_4_ + auVar104._28_4_));
          local_9c0._0_4_ =
               (float)(uVar68 ^ (uint)(auVar112._0_4_ * fVar173 +
                                      fVar101 * auVar43._0_4_ + fVar100 * auVar42._0_4_));
          local_9c0._4_4_ =
               (float)(uVar143 ^
                      (uint)(auVar112._4_4_ * fVar175 +
                            fVar14 * auVar43._4_4_ + fVar129 * auVar42._4_4_));
          local_9c0._8_4_ =
               (float)(uVar145 ^
                      (uint)(auVar112._8_4_ * fVar176 +
                            fVar18 * auVar43._8_4_ + fVar17 * auVar42._8_4_));
          local_9c0._12_4_ =
               (float)(uVar147 ^
                      (uint)(auVar112._12_4_ * fVar177 +
                            fVar23 * auVar43._12_4_ + fVar22 * auVar42._12_4_));
          local_9c0._16_4_ =
               (float)(uVar149 ^
                      (uint)(auVar112._16_4_ * fVar178 +
                            fVar28 * auVar43._16_4_ + fVar27 * auVar42._16_4_));
          local_9c0._20_4_ =
               (float)(uVar151 ^
                      (uint)(auVar112._20_4_ * fVar179 +
                            fVar33 * auVar43._20_4_ + fVar32 * auVar42._20_4_));
          local_9c0._24_4_ =
               (float)(uVar153 ^
                      (uint)(auVar112._24_4_ * fVar180 +
                            fVar38 * auVar43._24_4_ + fVar37 * auVar42._24_4_));
          local_9c0._28_4_ = (float)(uVar154 ^ (uint)(auVar43._28_4_ + auVar42._28_4_ + -0.0));
          auVar112 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar94 = vcmpps_avx(local_9e0,auVar112,5);
          auVar112 = vcmpps_avx(local_9c0,auVar112,5);
          auVar94 = vandps_avx(auVar94,auVar112);
          auVar115._8_4_ = 0x7fffffff;
          auVar115._0_8_ = 0x7fffffff7fffffff;
          auVar115._12_4_ = 0x7fffffff;
          auVar115._16_4_ = 0x7fffffff;
          auVar115._20_4_ = 0x7fffffff;
          auVar115._24_4_ = 0x7fffffff;
          auVar115._28_4_ = 0x7fffffff;
          local_980 = vandps_avx(auVar96,auVar115);
          auVar112 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar96,4);
          auVar94 = vandps_avx(auVar94,auVar112);
          auVar97._0_4_ = local_9e0._0_4_ + local_9c0._0_4_;
          auVar97._4_4_ = local_9e0._4_4_ + local_9c0._4_4_;
          auVar97._8_4_ = local_9e0._8_4_ + local_9c0._8_4_;
          auVar97._12_4_ = local_9e0._12_4_ + local_9c0._12_4_;
          auVar97._16_4_ = local_9e0._16_4_ + local_9c0._16_4_;
          auVar97._20_4_ = local_9e0._20_4_ + local_9c0._20_4_;
          auVar97._24_4_ = local_9e0._24_4_ + local_9c0._24_4_;
          auVar97._28_4_ = local_9e0._28_4_ + local_9c0._28_4_;
          auVar112 = vcmpps_avx(auVar97,local_980,2);
          auVar97 = auVar112 & auVar94;
          if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar97 >> 0x7f,0) != '\0') ||
                (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar97 >> 0xbf,0) != '\0') ||
              (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar97[0x1f] < '\0') {
            auVar94 = vandps_avx(auVar94,auVar112);
            auVar90 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
            local_9a0._0_4_ =
                 (float)(uVar68 ^ (uint)(fVar106 * fVar103 +
                                        (float)local_be0._0_4_ * fVar102 + fVar132 * local_920));
            local_9a0._4_4_ =
                 (float)(uVar143 ^
                        (uint)(fVar16 * fVar15 +
                              (float)local_be0._4_4_ * fVar184 + fVar134 * fStack_91c));
            local_9a0._8_4_ =
                 (float)(uVar145 ^
                        (uint)(fVar21 * fVar20 + fStack_bd8 * fVar19 + fVar135 * fStack_918));
            local_9a0._12_4_ =
                 (float)(uVar147 ^
                        (uint)(fVar26 * fVar25 + fStack_bd4 * fVar24 + fVar136 * fStack_914));
            local_9a0._16_4_ =
                 (float)(uVar149 ^
                        (uint)(fVar31 * fVar30 + fStack_bd0 * fVar29 + fVar137 * fStack_910));
            local_9a0._20_4_ =
                 (float)(uVar151 ^
                        (uint)(fVar36 * fVar35 + fStack_bcc * fVar34 + fVar138 * fStack_90c));
            local_9a0._24_4_ =
                 (float)(uVar153 ^
                        (uint)(fVar41 * fVar40 + fStack_bc8 * fVar39 + fVar139 * fStack_908));
            local_9a0._28_4_ = uVar154 ^ 0x7fc00000;
            fVar88 = *(float *)(ray + k * 4 + 0x30);
            fVar98 = local_980._0_4_;
            fVar99 = local_980._4_4_;
            auVar55._4_4_ = fVar99 * fVar88;
            auVar55._0_4_ = fVar98 * fVar88;
            fVar100 = local_980._8_4_;
            auVar55._8_4_ = fVar100 * fVar88;
            fVar101 = local_980._12_4_;
            auVar55._12_4_ = fVar101 * fVar88;
            fVar102 = local_980._16_4_;
            auVar55._16_4_ = fVar102 * fVar88;
            fVar103 = local_980._20_4_;
            auVar55._20_4_ = fVar103 * fVar88;
            fVar129 = local_980._24_4_;
            auVar55._24_4_ = fVar129 * fVar88;
            auVar55._28_4_ = fVar88;
            auVar94 = vcmpps_avx(auVar55,local_9a0,1);
            fVar88 = *(float *)(ray + k * 4 + 0x80);
            auVar56._4_4_ = fVar99 * fVar88;
            auVar56._0_4_ = fVar98 * fVar88;
            auVar56._8_4_ = fVar100 * fVar88;
            auVar56._12_4_ = fVar101 * fVar88;
            auVar56._16_4_ = fVar102 * fVar88;
            auVar56._20_4_ = fVar103 * fVar88;
            auVar56._24_4_ = fVar129 * fVar88;
            auVar56._28_4_ = fVar88;
            auVar112 = vcmpps_avx(local_9a0,auVar56,2);
            auVar94 = vandps_avx(auVar94,auVar112);
            auVar92 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
            auVar90 = vpand_avx(auVar92,auVar90);
            auVar92 = vpmovzxwd_avx(auVar90);
            auVar92 = vpslld_avx(auVar92,0x1f);
            auVar93 = vpsrad_avx(auVar92,0x1f);
            auVar92 = vpunpckhwd_avx(auVar90,auVar90);
            auVar92 = vpslld_avx(auVar92,0x1f);
            auVar92 = vpsrad_avx(auVar92,0x1f);
            local_900._16_16_ = auVar92;
            local_900._0_16_ = auVar93;
            if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_900 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_900 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_900 >> 0x7f,0) != '\0') ||
                  (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar92 >> 0x3f,0) != '\0') ||
                (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar92[0xf] < '\0') {
              local_940 = (float)local_be0._0_4_;
              fStack_93c = (float)local_be0._4_4_;
              fStack_938 = fStack_bd8;
              fStack_934 = fStack_bd4;
              fStack_930 = fStack_bd0;
              fStack_92c = fStack_bcc;
              fStack_928 = fStack_bc8;
              uStack_924 = uStack_bc4;
              uStack_904 = local_c20._28_4_;
              local_820 = local_a40;
              auVar112 = vrcpps_avx(local_980);
              fVar88 = auVar112._0_4_;
              auVar105._0_4_ = fVar98 * fVar88;
              fVar98 = auVar112._4_4_;
              auVar105._4_4_ = fVar99 * fVar98;
              fVar99 = auVar112._8_4_;
              auVar105._8_4_ = fVar100 * fVar99;
              fVar100 = auVar112._12_4_;
              auVar105._12_4_ = fVar101 * fVar100;
              fVar101 = auVar112._16_4_;
              auVar105._16_4_ = fVar102 * fVar101;
              fVar102 = auVar112._20_4_;
              auVar105._20_4_ = fVar103 * fVar102;
              fVar103 = auVar112._24_4_;
              auVar105._24_4_ = fVar129 * fVar103;
              auVar105._28_4_ = 0;
              auVar128._8_4_ = 0x3f800000;
              auVar128._0_8_ = &DAT_3f8000003f800000;
              auVar128._12_4_ = 0x3f800000;
              auVar128._16_4_ = 0x3f800000;
              auVar128._20_4_ = 0x3f800000;
              auVar128._24_4_ = 0x3f800000;
              auVar128._28_4_ = 0x3f800000;
              auVar94 = vsubps_avx(auVar128,auVar105);
              fStack_884 = auVar94._28_4_;
              fVar88 = fVar88 + fVar88 * auVar94._0_4_;
              fVar98 = fVar98 + fVar98 * auVar94._4_4_;
              fVar99 = fVar99 + fVar99 * auVar94._8_4_;
              fVar100 = fVar100 + fVar100 * auVar94._12_4_;
              fVar101 = fVar101 + fVar101 * auVar94._16_4_;
              fVar102 = fVar102 + fVar102 * auVar94._20_4_;
              fVar103 = fVar103 + fVar103 * auVar94._24_4_;
              local_8a0[0] = fVar88 * local_9a0._0_4_;
              local_8a0[1] = fVar98 * local_9a0._4_4_;
              local_8a0[2] = fVar99 * local_9a0._8_4_;
              local_8a0[3] = fVar100 * local_9a0._12_4_;
              fStack_890 = fVar101 * local_9a0._16_4_;
              fStack_88c = fVar102 * local_9a0._20_4_;
              fStack_888 = fVar103 * local_9a0._24_4_;
              auVar57._4_4_ = fVar98 * local_9e0._4_4_;
              auVar57._0_4_ = fVar88 * local_9e0._0_4_;
              auVar57._8_4_ = fVar99 * local_9e0._8_4_;
              auVar57._12_4_ = fVar100 * local_9e0._12_4_;
              auVar57._16_4_ = fVar101 * local_9e0._16_4_;
              auVar57._20_4_ = fVar102 * local_9e0._20_4_;
              auVar57._24_4_ = fVar103 * local_9e0._24_4_;
              auVar57._28_4_ = fStack_884;
              auVar94 = vminps_avx(auVar57,auVar128);
              auVar58._4_4_ = fVar98 * local_9c0._4_4_;
              auVar58._0_4_ = fVar88 * local_9c0._0_4_;
              auVar58._8_4_ = fVar99 * local_9c0._8_4_;
              auVar58._12_4_ = fVar100 * local_9c0._12_4_;
              auVar58._16_4_ = fVar101 * local_9c0._16_4_;
              auVar58._20_4_ = fVar102 * local_9c0._20_4_;
              auVar58._24_4_ = fVar103 * local_9c0._24_4_;
              auVar58._28_4_ = auVar112._28_4_ + fStack_884;
              auVar112 = vminps_avx(auVar58,auVar128);
              auVar97 = vsubps_avx(auVar128,auVar94);
              auVar104 = vsubps_avx(auVar128,auVar112);
              local_8c0 = vblendvps_avx(auVar112,auVar97,local_a40);
              local_8e0 = vblendvps_avx(auVar94,auVar104,local_a40);
              local_860._4_4_ = (float)local_be0._4_4_ * (float)local_a60._4_4_;
              local_860._0_4_ = (float)local_be0._0_4_ * (float)local_a60._0_4_;
              local_860._8_4_ = fStack_bd8 * fStack_a58;
              local_860._12_4_ = fStack_bd4 * fStack_a54;
              local_860._16_4_ = fStack_bd0 * fStack_a50;
              local_860._20_4_ = fStack_bcc * fStack_a4c;
              local_860._24_4_ = fStack_bc8 * fStack_a48;
              local_860._28_4_ = local_8e0._28_4_;
              local_840._4_4_ = fStack_91c * (float)local_a60._4_4_;
              local_840._0_4_ = local_920 * (float)local_a60._0_4_;
              local_840._8_4_ = fStack_918 * fStack_a58;
              local_840._12_4_ = fStack_914 * fStack_a54;
              local_840._16_4_ = fStack_910 * fStack_a50;
              local_840._20_4_ = fStack_90c * fStack_a4c;
              local_840._24_4_ = fStack_908 * fStack_a48;
              local_840._28_4_ = uStack_a44;
              local_880[0] = fVar106 * (float)local_a60._0_4_;
              local_880[1] = fVar16 * (float)local_a60._4_4_;
              local_880[2] = fVar21 * fStack_a58;
              local_880[3] = fVar26 * fStack_a54;
              fStack_870 = fVar31 * fStack_a50;
              fStack_86c = fVar36 * fStack_a4c;
              fStack_868 = fVar41 * fStack_a48;
              uStack_864 = local_8c0._28_4_;
              auVar90 = vpsllw_avx(auVar90,0xf);
              auVar90 = vpacksswb_avx(auVar90,auVar90);
              uVar64 = (ulong)(byte)(SUB161(auVar90 >> 7,0) & 1 |
                                     (SUB161(auVar90 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar90 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar90 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar90 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar90 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar90 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar90 >> 0x3f,0) << 7);
              do {
                uVar70 = 0;
                if (uVar64 != 0) {
                  for (; (uVar64 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
                  }
                }
                uVar68 = *(uint *)((long)&local_a00 + uVar70 * 4);
                pGVar10 = (pSVar8->geometries).items[uVar68].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar64 = uVar64 ^ 1L << (uVar70 & 0x3f);
                  bVar87 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar87 = false;
                }
                else {
                  local_c80._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  uVar3 = *(undefined4 *)(local_8e0 + uVar70 * 4);
                  local_ac0._4_4_ = uVar3;
                  local_ac0._0_4_ = uVar3;
                  local_ac0._8_4_ = uVar3;
                  local_ac0._12_4_ = uVar3;
                  fVar88 = local_8a0[uVar70 - 8];
                  local_ab0._4_4_ = fVar88;
                  local_ab0._0_4_ = fVar88;
                  local_ab0._8_4_ = fVar88;
                  local_ab0._12_4_ = fVar88;
                  *(float *)(ray + k * 4 + 0x80) = local_8a0[uVar70];
                  local_c50.context = context->user;
                  local_a90 = vpshufd_avx(ZEXT416(uVar68),0);
                  uVar3 = *(undefined4 *)((long)&local_a20 + uVar70 * 4);
                  local_aa0._4_4_ = uVar3;
                  local_aa0._0_4_ = uVar3;
                  local_aa0._8_4_ = uVar3;
                  local_aa0._12_4_ = uVar3;
                  fVar88 = local_880[uVar70];
                  local_af0._4_4_ = fVar88;
                  local_af0._0_4_ = fVar88;
                  local_af0._8_4_ = fVar88;
                  local_af0._12_4_ = fVar88;
                  local_ae0 = *(undefined4 *)(local_860 + uVar70 * 4);
                  local_ad0 = *(undefined4 *)(local_840 + uVar70 * 4);
                  vcmpps_avx(ZEXT1632(local_a90),ZEXT1632(local_a90),0xf);
                  uStack_a7c = (local_c50.context)->instID[0];
                  local_a80 = uStack_a7c;
                  uStack_a78 = uStack_a7c;
                  uStack_a74 = uStack_a7c;
                  uStack_a70 = (local_c50.context)->instPrimID[0];
                  uStack_a6c = uStack_a70;
                  uStack_a68 = uStack_a70;
                  uStack_a64 = uStack_a70;
                  local_ce0 = *local_cc8;
                  uStack_cd8 = local_cc8[1];
                  local_c50.valid = (int *)&local_ce0;
                  local_c50.geometryUserPtr = pGVar10->userPtr;
                  local_c50.hit = local_af0;
                  local_c50.N = 4;
                  local_c50.ray = (RTCRayN *)ray;
                  uStack_adc = local_ae0;
                  uStack_ad8 = local_ae0;
                  uStack_ad4 = local_ae0;
                  uStack_acc = local_ad0;
                  uStack_ac8 = local_ad0;
                  uStack_ac4 = local_ad0;
                  if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->occlusionFilterN)(&local_c50);
                  }
                  auVar44._8_8_ = uStack_cd8;
                  auVar44._0_8_ = local_ce0;
                  if (auVar44 == (undefined1  [16])0x0) {
                    auVar90 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar90 = auVar90 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&local_c50);
                    }
                    auVar63._8_8_ = uStack_cd8;
                    auVar63._0_8_ = local_ce0;
                    auVar92 = vpcmpeqd_avx((undefined1  [16])0x0,auVar63);
                    auVar90 = auVar92 ^ _DAT_01febe20;
                    auVar111._8_4_ = 0xff800000;
                    auVar111._0_8_ = 0xff800000ff800000;
                    auVar111._12_4_ = 0xff800000;
                    auVar92 = vblendvps_avx(auVar111,*(undefined1 (*) [16])(local_c50.ray + 0x80),
                                            auVar92);
                    *(undefined1 (*) [16])(local_c50.ray + 0x80) = auVar92;
                  }
                  auVar90 = vpslld_avx(auVar90,0x1f);
                  bVar61 = (auVar90 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar62 = (auVar90 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar60 = (auVar90 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                  bVar59 = -1 < auVar90[0xf];
                  bVar87 = ((bVar61 && bVar62) && bVar60) && bVar59;
                  if (((bVar61 && bVar62) && bVar60) && bVar59) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_c80._0_4_;
                    uVar64 = uVar64 ^ 1L << (uVar70 & 0x3f);
                  }
                }
                if (!bVar87) {
                  uVar68 = 0;
                  if (bVar86) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar68 = 1;
                  }
                  goto LAB_0036d10b;
                }
              } while (uVar64 != 0);
            }
          }
          local_cb8 = local_cb8 + 1;
          bVar86 = local_cb8 < local_cc0;
        } while (local_cb8 != local_cc0);
        uVar68 = 0;
      }
    }
LAB_0036d10b:
  } while ((uVar68 & 3) == 0);
  return puVar72 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }